

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * gauntlet_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  _Bool _Var2;
  int16_t iVar3;
  uint32_t uVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t h;
  wchar_t wVar7;
  uint32_t uVar8;
  chunk *c_00;
  chunk *c_01;
  chunk *c_02;
  loc_conflict lVar9;
  loc lVar10;
  loc_conflict lVar11;
  chunk_conflict *c_03;
  chunk *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  loc grid_1;
  loc grid;
  wchar_t line2;
  wchar_t line1;
  loc p_loc_in_l;
  loc p_loc_in_r;
  wchar_t x_size;
  wchar_t y_size;
  wchar_t gauntlet_wid;
  wchar_t gauntlet_hgt;
  chunk_conflict *arrival;
  chunk_conflict *right;
  chunk_conflict *gauntlet;
  chunk_conflict *left;
  chunk_conflict *c;
  wchar_t k;
  wchar_t i;
  char **p_error_local;
  wchar_t min_width_local;
  wchar_t min_height_local;
  player *p_local;
  
  uVar4 = Rand_div(5);
  wVar5 = (uVar4 + 1) * 2 + L'\x03';
  uVar4 = Rand_div(10);
  wVar6 = (uVar4 + 1) * 2 + L'\x13';
  uVar1 = z_info->dungeon_hgt;
  uVar4 = Rand_div(0x19 - wVar5);
  h = uVar1 - uVar4;
  uVar1 = z_info->dungeon_wid;
  uVar4 = Rand_div(0x2d - wVar6);
  wVar7 = (((uint)uVar1 - wVar6) + -2) / 2 - uVar4;
  if ((dun->persist & 1U) == 0) {
    c_00 = (chunk *)labyrinth_chunk((int)p->depth,wVar5,wVar6,false,false);
    if (c_00 == (chunk *)0x0) {
      *p_error = "labyrinth chunk could not be generated";
    }
    else {
      c_01 = (chunk *)cavern_chunk((int)p->depth,h,wVar7,(connector *)0x0);
      if (c_01 == (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)c_00);
        cave_free((chunk_conflict *)c_00);
        *p_error = "left cavern chunk could not be generated";
      }
      else {
        c_02 = (chunk *)cavern_chunk((int)p->depth,h,wVar7,(connector *)0x0);
        if (c_02 == (chunk *)0x0) {
          uncreate_artifacts((chunk_conflict *)c_00);
          cave_free((chunk_conflict *)c_00);
          uncreate_artifacts((chunk_conflict *)c_01);
          cave_free((chunk_conflict *)c_01);
          *p_error = "right cavern chunk could not be generated";
        }
        else {
          wVar5 = c_01->width;
          wVar6 = wVar5 + c_00->width;
          generate_mark((chunk_conflict *)c_01,L'\0',L'\0',c_01->height + L'\xffffffff',
                        c_01->width + L'\xffffffff',L'\x0f');
          generate_mark((chunk_conflict *)c_00,L'\0',L'\0',c_00->height + L'\xffffffff',
                        c_00->width + L'\xffffffff',L'\x10');
          generate_mark((chunk_conflict *)c_00,L'\0',L'\0',c_00->height + L'\xffffffff',
                        c_00->width + L'\xffffffff',L'\x0f');
          wVar7 = rand_range(2,3);
          alloc_stairs((chunk_conflict *)c_02,L'\x06',wVar7,L'\0',false,(connector *)0x0,
                       (_Bool)(dun->quest & 1));
          wVar7 = rand_range(1,3);
          alloc_stairs((chunk_conflict *)c_01,L'\x05',wVar7,L'\0',false,(connector *)0x0,
                       (_Bool)(dun->quest & 1));
          c._4_4_ = 0;
          while( true ) {
            uVar4 = Rand_div(c_00->height + L'\xfffffffe');
            lVar9 = (loc_conflict)loc(0,uVar4 + 1);
            if (0x13 < c._4_4_) break;
            lVar10 = loc(1,0);
            lVar11 = (loc_conflict)loc_sum((loc)lVar9,lVar10);
            _Var2 = square_isperm(c_00,lVar11);
            if (!_Var2) {
              square_set_feat(c_00,lVar9,L'\x15');
              c._4_4_ = 0;
              while( true ) {
                wVar7 = c_00->width;
                uVar4 = Rand_div(c_00->height + L'\xfffffffe');
                lVar9 = (loc_conflict)loc(wVar7 + L'\xffffffff',uVar4 + 1);
                if (0x13 < c._4_4_) {
                  uncreate_artifacts((chunk_conflict *)c_00);
                  cave_free((chunk_conflict *)c_00);
                  uncreate_artifacts((chunk_conflict *)c_01);
                  cave_free((chunk_conflict *)c_01);
                  uncreate_artifacts((chunk_conflict *)c_02);
                  cave_free((chunk_conflict *)c_02);
                  *p_error = "could not open entrance to the labyrinth";
                  return (chunk_conflict *)0x0;
                }
                lVar10 = loc(-1,0);
                lVar11 = (loc_conflict)loc_sum((loc)lVar9,lVar10);
                _Var2 = square_isperm(c_00,lVar11);
                if (!_Var2) break;
                c._4_4_ = c._4_4_ + 1;
              }
              square_set_feat(c_00,lVar9,L'\x15');
              if ((int)p->depth / 3 < 0xb) {
                local_e4 = (int)p->depth / 3;
              }
              else {
                local_e4 = 10;
              }
              if (local_e4 < 2) {
                local_e8 = 2;
              }
              else {
                if ((int)p->depth / 3 < 0xb) {
                  local_ec = (int)p->depth / 3;
                }
                else {
                  local_ec = 10;
                }
                local_e8 = local_ec;
              }
              uVar4 = local_e8 / 2;
              local_f8 = c_01;
              if ((p->upkeep->create_down_stair & 1U) != 0) {
                local_f8 = c_02;
              }
              _Var2 = new_player_spot((chunk_conflict *)local_f8,p);
              if (!_Var2) {
                uncreate_artifacts((chunk_conflict *)c_00);
                cave_free((chunk_conflict *)c_00);
                uncreate_artifacts((chunk_conflict *)c_01);
                cave_free((chunk_conflict *)c_01);
                uncreate_artifacts((chunk_conflict *)c_02);
                cave_free((chunk_conflict *)c_02);
                *p_error = "could not place player";
                return (chunk_conflict *)0x0;
              }
              if (local_f8 == c_02) {
                p_loc_in_l = p->grid;
                line1 = (p->grid).y;
                line2 = wVar6 + (p->grid).x;
              }
              else {
                line2 = (p->grid).x;
                line1 = (p->grid).y;
                p_loc_in_l.y = (p->grid).y;
                p_loc_in_l.x = (p->grid).x - wVar6;
              }
              uVar1 = z_info->level_monster_min;
              uVar8 = Rand_div(4);
              for (c._4_4_ = (uint)uVar1 + uVar8 + 1 + uVar4; 0 < c._4_4_; c._4_4_ = c._4_4_ + -1) {
                pick_and_place_distant_monster(c_01,_line2,L'\0',true,c_01->depth);
              }
              uVar1 = z_info->level_monster_min;
              uVar8 = Rand_div(4);
              for (c._4_4_ = (uint)uVar1 + uVar8 + 1 + uVar4; 0 < c._4_4_; c._4_4_ = c._4_4_ + -1) {
                pick_and_place_distant_monster(c_02,(loc_conflict)p_loc_in_l,L'\0',true,c_02->depth)
                ;
              }
              uVar1 = z_info->level_monster_min;
              uVar8 = Rand_div(6);
              do {
                set_pit_type(c_00->depth,L'\0');
                _Var2 = mon_restrict(dun->pit_type->name,c_00->depth,c_00->depth,true);
              } while (!_Var2);
              if (((player->opts).opt[0x18] & 1U) != 0) {
                msg("Gauntlet - %s",dun->pit_type->name);
              }
              spread_monsters(c_00,dun->pit_type->name,c_00->depth,(uint)uVar1 + uVar8 + 1 + uVar4,
                              c_00->height / 2,c_00->width / 2,c_00->height / 2,c_00->width / 2,
                              '\x06');
              mon_restrict((char *)0x0,c_00->depth,c_00->depth,false);
              c_03 = cave_new(h,c_01->width + c_00->width + c_02->width);
              c_03->depth = (int)p->depth;
              fill_rectangle(c_03,L'\0',L'\0',c_03->height + L'\xffffffff',
                             c_03->width + L'\xffffffff',L'\x15',L'\0');
              fill_rectangle(c_03,L'\0',wVar5,c_03->height + L'\xffffffff',wVar6 + L'\xffffffff',
                             L'\x16',L'\0');
              chunk_copy(c_03,p,(chunk_conflict *)c_01,L'\0',L'\0',L'\0',false);
              chunk_copy(c_03,p,(chunk_conflict *)c_00,(h - c_00->height) / 2,wVar5,L'\0',false);
              chunk_copy(c_03,p,(chunk_conflict *)c_02,L'\0',wVar6,L'\0',false);
              cave_free((chunk_conflict *)c_01);
              cave_free((chunk_conflict *)c_00);
              cave_free((chunk_conflict *)c_02);
              draw_rectangle(c_03,L'\0',L'\0',c_03->height + L'\xffffffff',
                             c_03->width + L'\xffffffff',L'\x16',L'\0',true);
              ensure_connectedness(c_03,true);
              uVar8 = Rand_div(uVar4);
              alloc_objects(c_03,L'\x01',L'\0',uVar8 + L'\x01',c_03->depth,'\0');
              uVar4 = Rand_div(uVar4);
              alloc_objects(c_03,L'\x01',L'\x01',uVar4 + L'\x01',c_03->depth,'\0');
              iVar3 = Rand_normal((uint)z_info->room_item_av,3);
              alloc_objects(c_03,L'\x02',L'\x03',(int)iVar3,c_03->depth,'\x01');
              iVar3 = Rand_normal((uint)z_info->both_item_av,3);
              alloc_objects(c_03,L'\x03',L'\x03',(int)iVar3,c_03->depth,'\x01');
              iVar3 = Rand_normal((uint)z_info->both_gold_av,3);
              alloc_objects(c_03,L'\x03',L'\x02',(int)iVar3,c_03->depth,'\x01');
              return c_03;
            }
            c._4_4_ = c._4_4_ + 1;
          }
          uncreate_artifacts((chunk_conflict *)c_00);
          cave_free((chunk_conflict *)c_00);
          uncreate_artifacts((chunk_conflict *)c_01);
          cave_free((chunk_conflict *)c_01);
          uncreate_artifacts((chunk_conflict *)c_02);
          cave_free((chunk_conflict *)c_02);
          *p_error = "could not open entrance to the labyrinth";
        }
      }
    }
  }
  else {
    *p_error = "no gauntlet levels in persistent dungeons";
  }
  return (chunk_conflict *)0x0;
}

Assistant:

struct chunk *gauntlet_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	struct chunk *c;
	struct chunk *left;
	struct chunk *gauntlet;
	struct chunk *right;
	struct chunk *arrival;
	int gauntlet_hgt = 2 * randint1(5) + 3;
	int gauntlet_wid = 2 * randint1(10) + 19;
	int y_size = z_info->dungeon_hgt - randint0(25 - gauntlet_hgt);
	/*
	 * labyrinth_gen() generates something that's two grids wider than
	 * the argument passed, thus the extra "- 2" below.
	 */
	int x_size = (z_info->dungeon_wid - gauntlet_wid - 2) / 2 -
		randint0(45 - gauntlet_wid);
	struct loc p_loc_in_r, p_loc_in_l;
	int line1, line2;

	/* No persistent levels of this type for now */
	if (dun->persist) {
		*p_error = "no gauntlet levels in persistent dungeons";
		return NULL;
	}

	gauntlet = labyrinth_chunk(p->depth, gauntlet_hgt, gauntlet_wid, false,
		false);
	if (!gauntlet) {
		*p_error = "labyrinth chunk could not be generated";
		return NULL;
	}

	left = cavern_chunk(p->depth, y_size, x_size, NULL);
	if (!left) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		*p_error = "left cavern chunk could not be generated";
		return NULL;
	}

	right = cavern_chunk(p->depth, y_size, x_size, NULL);
	if (!right) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		uncreate_artifacts(left);
		cave_free(left);
		*p_error = "right cavern chunk could not be generated";
		return NULL;
	}

	/* Record lines between chunks */
	line1 = left->width;
	line2 = line1 + gauntlet->width;

	/* Set the movement and mapping restrictions */
	generate_mark(left, 0, 0, left->height - 1, left->width - 1,
		SQUARE_NO_TELEPORT);
	generate_mark(gauntlet, 0, 0, gauntlet->height - 1, gauntlet->width - 1,
		SQUARE_NO_MAP);
	generate_mark(gauntlet, 0, 0, gauntlet->height - 1, gauntlet->width - 1,
		SQUARE_NO_TELEPORT);

	/* Place down stairs in the right cavern */
	alloc_stairs(right, FEAT_MORE, rand_range(2, 3), 0, false, NULL,
		dun->quest);

	/* Place up stairs in the left cavern */
	alloc_stairs(left, FEAT_LESS, rand_range(1, 3), 0, false, NULL,
		dun->quest);

	/*
	 * Open the ends of the gauntlet.  Make sure the opening is
	 * horizontally adjacent to a non-permanent wall for interoperability
	 * with ensure_connectedness().
	 */
	i = 0;
	while (1) {
		struct loc grid = loc(0, randint1(gauntlet->height - 2));

		if (i >= 20) {
			uncreate_artifacts(gauntlet);
			cave_free(gauntlet);
			uncreate_artifacts(left);
			cave_free(left);
			uncreate_artifacts(right);
			cave_free(right);
			*p_error = "could not open entrance to the labyrinth";
			return NULL;
		}
		if (!square_isperm(gauntlet, loc_sum(grid, loc(1, 0)))) {
			square_set_feat(gauntlet, grid, FEAT_GRANITE);
			break;
		}
		++i;
	}
	i = 0;
	while (1) {
		struct loc grid = loc(gauntlet->width - 1,
			randint1(gauntlet->height - 2));

		if (i >= 20) {
			uncreate_artifacts(gauntlet);
			cave_free(gauntlet);
			uncreate_artifacts(left);
			cave_free(left);
			uncreate_artifacts(right);
			cave_free(right);
			*p_error = "could not open entrance to the labyrinth";
			return NULL;
		}
		if (!square_isperm(gauntlet, loc_sum(grid, loc(-1, 0)))) {
			square_set_feat(gauntlet, grid, FEAT_GRANITE);
			break;
		}
		++i;
	}

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(p->depth / 3, 10), 2) / 2;

	/* Put the character in the arrival cavern */
	arrival = (p->upkeep->create_down_stair) ? right : left;
	if (!new_player_spot(arrival, p)) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		uncreate_artifacts(left);
		cave_free(left);
		uncreate_artifacts(right);
		cave_free(right);
		*p_error = "could not place player";
		return NULL;
	}
	/*
	 * Account for the player's location relative to the right and left
	 * chunks for use in pick_and_place_distant_monster().  The
	 * transformations here have to match what the calls to chunk_copy()
	 * below do.
	 */
	if (arrival == right) {
		p_loc_in_r = p->grid;
		p_loc_in_l.x = line2 + p->grid.x;
		p_loc_in_l.y = p->grid.y;
	} else {
		p_loc_in_l = p->grid;
		p_loc_in_r.x = p->grid.x - line2;
		p_loc_in_r.y = p->grid.y;
	}

	/* Pick some monsters for the left cavern */
	i = z_info->level_monster_min + randint1(4) + k;

	/* Place the monsters */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(left, p_loc_in_l, 0, true,
			left->depth);
	}

	/* Pick some of monsters for the right cavern */
	i = z_info->level_monster_min + randint1(4) + k;

	/* Place the monsters */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(right, p_loc_in_r, 0, true,
			right->depth);
	}

	/* Pick a larger number of monsters for the gauntlet */
	i = (z_info->level_monster_min + randint1(6) + k);

	/* Find appropriate monsters */
	while (true) {
		/* Choose a pit profile */
		set_pit_type(gauntlet->depth, 0);

		/* Set monster generation restrictions */
		if (mon_restrict(dun->pit_type->name, gauntlet->depth, gauntlet->depth, true))
			break;
	}

	ROOM_LOG("Gauntlet - %s", dun->pit_type->name);

	/* Place labyrinth monsters */
	spread_monsters(gauntlet, dun->pit_type->name, gauntlet->depth, i,
					gauntlet->height / 2, gauntlet->width / 2,
					gauntlet->height / 2, gauntlet->width / 2,
					ORIGIN_LABYRINTH);

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, gauntlet->depth, gauntlet->depth, false);

	/* Make the level */
	c = cave_new(y_size, left->width + gauntlet->width + right->width);
	c->depth = p->depth;

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_GRANITE, SQUARE_NONE);

	/* Fill the area between the caverns with permanent rock */
	fill_rectangle(c, 0, line1, c->height - 1, line2 - 1, FEAT_PERM,
		SQUARE_NONE);

	/* Copy in the pieces */
	chunk_copy(c, p, left, 0, 0, 0, false);
	chunk_copy(c, p, gauntlet, (y_size - gauntlet->height) / 2, line1, 0, false);
	chunk_copy(c, p, right, 0, line2, 0, false);

	/* Free the chunks */
	cave_free(left);
	cave_free(gauntlet);
	cave_free(right);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect */
	ensure_connectedness(c, true);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k), c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}